

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setup_common.cpp
# Opt level: O1

CMutableTransaction * __thiscall
TestChain100Setup::CreateValidMempoolTransaction
          (CMutableTransaction *__return_storage_ptr__,TestChain100Setup *this,
          CTransactionRef input_transaction,uint32_t input_vout,int input_height,
          CKey input_signing_key,CScript output_destination,CAmount output_amount,bool submit)

{
  uchar *puVar1;
  long lVar2;
  pointer pCVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  CScript scriptPubKeyIn;
  element_type *peVar8;
  undefined4 in_register_0000008c;
  long in_FS_OFFSET;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l;
  initializer_list<COutPoint> __l_00;
  initializer_list<CKey> __l_01;
  initializer_list<CTxOut> __l_02;
  undefined8 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe74 [20];
  allocator_type local_169;
  vector<CKey,_std::allocator<CKey>_> local_168;
  allocator_type local_149;
  vector<COutPoint,_std::allocator<COutPoint>_> local_148;
  allocator_type local_129;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_128;
  CTxOut local_110;
  undefined1 local_e8 [8];
  __uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  local_e0;
  COutPoint local_d8;
  shared_ptr<const_CTransaction> local_b0;
  direct_or_indirect local_a0;
  uint local_84;
  CTxOut output;
  
  peVar8 = input_transaction.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar3 = (peVar8->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = *(undefined8 *)((long)&(pCVar3->scriptSig).super_CScriptBase + 0x11);
  uVar5 = *(undefined8 *)((long)&(pCVar3->scriptSig).super_CScriptBase + 0x19);
  uVar6 = *(undefined8 *)((long)&pCVar3->nSequence + 1);
  uVar7 = *(undefined8 *)((long)&(pCVar3->scriptWitness).stack + 1);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_a0.indirect_contents,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)input_signing_key._0_8_);
  scriptPubKeyIn.super_CScriptBase._union.indirect_contents.capacity = input_vout;
  scriptPubKeyIn.super_CScriptBase._union.indirect_contents.indirect =
       (char *)in_stack_fffffffffffffe68;
  scriptPubKeyIn.super_CScriptBase._12_20_ = in_stack_fffffffffffffe74;
  CTxOut::CTxOut(&output,(CAmount *)&input_signing_key.keydata,scriptPubKeyIn);
  if (0x1c < local_84) {
    free(local_a0.indirect_contents.indirect);
    local_a0.indirect_contents.indirect = (char *)0x0;
  }
  local_b0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (peVar8->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_b0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (peVar8->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if ((pointer)local_b0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      puVar1 = (((pointer)
                local_b0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems +
               8;
      *(int *)puVar1 = *(int *)puVar1 + 1;
      UNLOCK();
    }
    else {
      puVar1 = (((pointer)
                local_b0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems +
               8;
      *(int *)puVar1 = *(int *)puVar1 + 1;
    }
  }
  __l._M_len = 1;
  __l._M_array = &local_b0;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(&local_128,__l,&local_129);
  __l_00._M_len = 1;
  __l_00._M_array = &local_d8;
  local_d8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ = uVar4;
  local_d8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ = uVar5;
  local_d8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ = uVar6;
  local_d8.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = uVar7;
  local_d8.n = (uint32_t)
               input_transaction.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector(&local_148,__l_00,&local_149);
  CKey::CKey((CKey *)local_e8,(CKey *)CONCAT44(in_register_0000008c,input_height));
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)local_e8;
  std::vector<CKey,_std::allocator<CKey>_>::vector(&local_168,__l_01,&local_169);
  local_110.nValue = output.nValue;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            (&local_110.scriptPubKey.super_CScriptBase,&output.scriptPubKey.super_CScriptBase);
  __l_02._M_len = 1;
  __l_02._M_array = &local_110;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)&stack0xfffffffffffffe78,__l_02,
             (allocator_type *)&stack0xfffffffffffffe77);
  CreateValidMempoolTransaction
            (__return_storage_ptr__,this,&local_128,&local_148,input_vout,&local_168,
             (vector<CTxOut,_std::allocator<CTxOut>_> *)&stack0xfffffffffffffe78,
             (bool)output_destination.super_CScriptBase._union.direct[0]);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)&stack0xfffffffffffffe78);
  if (0x1c < local_110.scriptPubKey.super_CScriptBase._size) {
    free(local_110.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect);
    local_110.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  }
  std::vector<CKey,_std::allocator<CKey>_>::~vector(&local_168);
  if ((_Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
       )local_e0._M_t.
        super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
        .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl !=
      (array<unsigned_char,_32UL> *)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_e0,
               (array<unsigned_char,_32UL> *)
               local_e0._M_t.
               super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
               .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl);
  }
  if (local_148.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_148.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.super__Vector_base<COutPoint,_std::allocator<COutPoint>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&local_128);
  if ((pointer)local_b0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b0.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (0x1c < output.scriptPubKey.super_CScriptBase._size) {
    free(output.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect);
    output.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CMutableTransaction TestChain100Setup::CreateValidMempoolTransaction(CTransactionRef input_transaction,
                                                                     uint32_t input_vout,
                                                                     int input_height,
                                                                     CKey input_signing_key,
                                                                     CScript output_destination,
                                                                     CAmount output_amount,
                                                                     bool submit)
{
    COutPoint input{input_transaction->GetHash(), input_vout};
    CTxOut output{output_amount, output_destination};
    return CreateValidMempoolTransaction(/*input_transactions=*/{input_transaction},
                                         /*inputs=*/{input},
                                         /*input_height=*/input_height,
                                         /*input_signing_keys=*/{input_signing_key},
                                         /*outputs=*/{output},
                                         /*submit=*/submit);
}